

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::
Attribute_Access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::AST_Node>
::do_call(Attribute_Access<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::AST_Node>
          *this,Function_Params *params,Type_Conversions_State *t_conversions)

{
  Type_Conversions *this_00;
  Boxed_Value *in_RCX;
  Boxed_Value BVar1;
  
  this_00 = (t_conversions->m_conversions)._M_data;
  if ((*(byte *)(*(long *)this_00 + 0x10) & 1) == 0) {
    boxed_cast<chaiscript::AST_Node*>((chaiscript *)this_00,in_RCX,t_conversions);
  }
  else {
    boxed_cast<chaiscript::AST_Node_const*>((chaiscript *)this_00,in_RCX,t_conversions);
  }
  BVar1 = detail::Handle_Return_Ref<std::__cxx11::string_const&,false>::
          handle<std::__cxx11::string_const&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_call(const Function_Params &params, const Type_Conversions_State &t_conversions) const override {
        const Boxed_Value &bv = params[0];
        if (bv.is_const()) {
          const Class *o = boxed_cast<const Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        } else {
          Class *o = boxed_cast<Class *>(bv, &t_conversions);
          return do_call_impl<T>(o);
        }
      }